

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O2

void av1_block_yrd(MACROBLOCK *x,RD_STATS *this_rdc,int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  long lVar2;
  int16_t *piVar3;
  int16_t *piVar4;
  ulong uVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  int16_t *piVar9;
  int16_t *piVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  tran_low_t *ptVar14;
  intptr_t iVar15;
  undefined7 in_register_00000081;
  macroblock_plane *p;
  int iVar16;
  int c;
  long lVar17;
  bool bVar18;
  uint16_t eob [1];
  int bw;
  tran_low_t qcoeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  tran_low_t coeff_buf [256];
  int16_t *piVar19;
  int16_t *piVar20;
  int16_t *piVar21;
  ushort local_d4a;
  uint local_d48;
  uint local_d44;
  tran_low_t *local_d40;
  uint local_d34;
  ulong local_d30;
  RD_STATS *local_d28;
  ulong local_d20;
  uint8_t *local_d18;
  int local_d0c;
  undefined4 local_d08;
  int local_d04;
  long local_d00;
  long local_cf8;
  long local_cf0;
  ulong local_ce8;
  long local_ce0;
  ulong local_cd8;
  int local_cd0;
  uint local_ccc;
  SCAN_ORDER (*local_cc8) [16];
  ulong local_cc0;
  long local_cb8;
  uint *local_cb0;
  long local_ca8;
  long local_ca0;
  long local_c98;
  ulong local_c90;
  int64_t local_c88;
  int local_c80 [256];
  tran_low_t local_880 [256];
  tran_low_t local_480 [276];
  
  uVar13 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  local_d34 = (uint)CONCAT71(in_register_00000081,tx_size);
  bVar6 = (byte)(local_d34 * 2);
  local_d04 = 1 << (bVar6 & 0x1f);
  local_d44 = 1 << (tx_size & 0x1f);
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar13];
  local_d20 = (ulong)bVar1;
  iVar11 = (x->e_mbd).mb_to_right_edge;
  iVar16 = (x->e_mbd).mb_to_bottom_edge;
  local_d18 = (uint8_t *)CONCAT44(local_d18._4_4_,local_d34 * 2);
  local_d0c = (int)((uint)bVar1 << (bVar6 & 0x1f)) >> (tx_size & 0x1f);
  local_d00 = (long)(iVar11 >> 0x1f & iVar11 >> 5);
  local_cf8 = (long)(iVar16 >> 0x1f & iVar16 >> 5) +
              (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar13];
  iVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar13] << 2;
  local_d48 = ((x->e_mbd).cur_buf)->flags;
  uVar8 = (uint)bVar1 * 4;
  local_cc0 = (ulong)uVar8;
  uVar13 = (ulong)uVar8;
  local_d28 = this_rdc;
  local_cb0 = (uint *)skippable;
  if ((local_d48 & 8) == 0) {
    (*aom_subtract_block)
              (iVar11,uVar8,x->plane[0].src_diff,uVar13,x->plane[0].src.buf,
               (long)x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
               (long)(x->e_mbd).plane[0].dst.stride);
  }
  else {
    aom_highbd_subtract_block_sse2
              (iVar11,uVar8,x->plane[0].src_diff,local_cc0,x->plane[0].src.buf,
               (long)x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
               (long)(x->e_mbd).plane[0].dst.stride);
  }
  local_d28->dist = 0;
  local_d28->rate = 0;
  local_d00 = local_d00 + local_d20;
  local_d08 = (undefined4)CONCAT71((int7)((ulong)local_d00 >> 8),1);
  local_ce8 = uVar13;
  if (((((byte)local_d34 == '\x01') && ((0x3affe0UL >> ((ulong)bsize & 0x3f) & 1) != 0)) &&
      ((local_d48 & 8) == 0)) && ((0x3dfffaUL >> ((ulong)bsize & 0x3f) & 1) != 0)) {
    iVar16 = (int)local_d20;
    iVar11 = (int)local_d00;
    if (iVar16 < (int)local_d00) {
      iVar11 = iVar16;
    }
    local_cf0 = (long)iVar11;
    local_d30 = (ulong)local_d44;
    local_d40 = (tran_low_t *)CONCAT44(local_d40._4_4_,local_d44 * iVar16 * 0x10);
    uVar13 = 0;
    iVar11 = 0;
    lVar2 = 0;
    while (lVar2 < local_cf8) {
      iVar16 = iVar11 << 4;
      local_ce0 = lVar2;
      local_cd8 = uVar13;
      for (lVar17 = 0; lVar17 < local_cf0; lVar17 = lVar17 + 4) {
        (*aom_hadamard_lp_8x8_dual)
                  (x->plane[0].src_diff + (int)uVar13,local_ce8,
                   (int16_t *)((long)iVar16 * 2 + (long)x->plane[0].coeff));
        iVar11 = iVar11 + 8;
        iVar16 = iVar16 + 0x80;
        uVar13 = (ulong)((int)uVar13 + 0x10);
      }
      uVar13 = (ulong)(uint)((int)local_cd8 + (int)local_d40);
      lVar2 = local_ce0 + local_d30;
    }
    local_d08 = 0;
  }
  uVar8 = 1;
  local_ccc = local_d34 & 0xff;
  local_cc8 = av1_scan_orders + (byte)local_d34;
  local_d30 = (ulong)(uint)(0x10 << ((byte)local_d18 & 0x1f));
  local_d18 = (x->txfm_search_info).blk_skip;
  local_cb8 = (long)(int)local_d44;
  local_ca0 = (long)(int)local_cf8;
  uVar13 = local_d20 & 0xffffffff;
  local_d0c = local_d0c << 4;
  local_d04 = local_d04 << 4;
  local_d20 = (ulong)((int)local_d20 * local_d44 * 0x10);
  local_d44 = local_d44 << 2;
  local_ca8 = uVar13 * local_cb8;
  local_d40 = local_480;
  uVar5 = 0;
  iVar16 = 0;
  local_c98 = 0;
  iVar11 = 0;
  uVar13 = local_ce8;
  do {
    if (local_ca0 <= local_c98) {
      *local_cb0 = uVar8;
      local_d28->skip_txfm = (uint8_t)uVar8;
      if (local_d28->sse != 0x7fffffffffffffff) {
        lVar2 = (local_d28->sse << 6) >> 2;
        local_d28->sse = lVar2;
        if (uVar8 != 0) {
          local_d28->dist = lVar2;
          return;
        }
      }
      local_d28->rate = iVar11 * 0x200 + local_d28->rate * 0x800;
      return;
    }
    local_cd0 = iVar16;
    local_c90 = uVar5;
    for (lVar2 = 0; ptVar14 = local_d40, lVar2 < local_d00; lVar2 = lVar2 + local_cb8) {
      piVar9 = x->plane[0].src_diff + (int)uVar5;
      local_cf0 = CONCAT44(local_cf0._4_4_,uVar8);
      local_cd8 = CONCAT44(local_cd8._4_4_,iVar11);
      local_ce0 = CONCAT44(local_ce0._4_4_,(int)uVar5);
      local_cf8 = CONCAT44(local_cf8._4_4_,iVar16);
      if ((byte)local_d34 == '\x01') {
        if ((local_d48 & 8) != 0) {
          aom_hadamard_8x8_sse2(piVar9,uVar13,local_480);
          piVar9 = x->plane[0].zbin_QTX;
          piVar10 = x->plane[0].quant_fp_QTX;
          piVar4 = x->plane[0].round_fp_QTX;
          piVar21 = x->plane[0].quant_shift_QTX;
          iVar15 = 0x40;
          piVar20 = av1_default_iscan_8x8_transpose;
          piVar3 = default_scan_8x8_transpose;
          goto LAB_0020cea7;
        }
        if ((char)local_d08 == '\0') {
          ptVar14 = (tran_low_t *)((long)iVar16 * 2 + (long)x->plane[0].coeff);
        }
        else {
          aom_hadamard_lp_8x8_sse2(piVar9,uVar13,(int16_t *)local_d40);
        }
        piVar9 = x->plane[0].quant_fp_QTX;
        piVar10 = x->plane[0].round_fp_QTX;
        iVar15 = 0x40;
        piVar21 = av1_default_iscan_8x8_transpose;
        piVar4 = default_scan_8x8_transpose;
        local_d40 = ptVar14;
LAB_0020d105:
        piVar3 = x->plane[0].dequant_QTX;
LAB_0020d114:
        (*av1_quantize_lp)((int16_t *)ptVar14,iVar15,piVar10,piVar9,(int16_t *)local_c80,
                           (int16_t *)local_880,piVar3,&local_d4a,piVar4,piVar21);
        bVar18 = local_d4a == 0;
        local_d18[lVar2] = bVar18;
        uVar12 = (uint)local_d4a;
        if (!bVar18) {
          if (uVar12 == 1) {
            uVar7 = -(ushort)local_c80[0];
            if (0 < (short)(ushort)local_c80[0]) {
              uVar7 = (ushort)local_c80[0];
            }
            uVar8 = (uint)uVar7;
          }
          else {
            uVar8 = (*aom_satd_lp)((int16_t *)local_c80,(int)local_d30);
          }
          local_d28->rate = local_d28->rate + uVar8;
        }
        uVar8 = bVar18 & (uint)local_cf0;
        uVar12 = uVar12 + 1;
        iVar11 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        lVar17 = (*av1_block_error_lp)((int16_t *)local_d40,(int16_t *)local_880,local_d30);
      }
      else {
        if (local_ccc == 2) {
          if ((local_d48 & 8) == 0) {
            (*aom_hadamard_lp_16x16)(piVar9,uVar13,(int16_t *)local_d40);
            piVar9 = x->plane[0].quant_fp_QTX;
            piVar10 = x->plane[0].round_fp_QTX;
            iVar15 = 0x100;
            piVar21 = av1_default_iscan_lp_16x16_transpose;
            piVar4 = default_scan_lp_16x16_transpose;
            goto LAB_0020d105;
          }
          (*aom_hadamard_16x16)(piVar9,uVar13,local_480);
          piVar9 = x->plane[0].zbin_QTX;
          piVar10 = x->plane[0].quant_fp_QTX;
          piVar4 = x->plane[0].round_fp_QTX;
          piVar21 = x->plane[0].quant_shift_QTX;
          iVar15 = 0x100;
          piVar20 = av1_default_iscan_fp_16x16_transpose;
          piVar3 = default_scan_fp_16x16_transpose;
LAB_0020cea7:
          piVar19 = x->plane[0].dequant_QTX;
        }
        else {
          if ((local_d48 & 8) == 0) {
            aom_fdct4x4_lp_sse2(piVar9,(int16_t *)local_d40,(int)local_cc0);
            piVar9 = x->plane[0].quant_fp_QTX;
            piVar10 = x->plane[0].round_fp_QTX;
            piVar3 = x->plane[0].dequant_QTX;
            piVar4 = (*local_cc8)[0].scan;
            piVar21 = (*local_cc8)[0].iscan;
            iVar15 = 0x10;
            goto LAB_0020d114;
          }
          aom_fdct4x4_sse2(piVar9,local_480,(int)local_cc0);
          piVar9 = x->plane[0].zbin_QTX;
          piVar10 = x->plane[0].quant_fp_QTX;
          piVar4 = x->plane[0].round_fp_QTX;
          piVar21 = x->plane[0].quant_shift_QTX;
          piVar19 = x->plane[0].dequant_QTX;
          piVar3 = (*local_cc8)[0].scan;
          piVar20 = (*local_cc8)[0].iscan;
          iVar15 = 0x10;
        }
        (*av1_quantize_fp)(local_480,iVar15,piVar9,piVar4,piVar10,piVar21,local_c80,local_880,
                           piVar19,&local_d4a,piVar3,piVar20);
        bVar18 = local_d4a == 0;
        local_d18[lVar2] = bVar18;
        uVar12 = (uint)local_d4a;
        if (!bVar18) {
          if (uVar12 == 1) {
            iVar11 = -local_c80[0];
            if (0 < local_c80[0]) {
              iVar11 = local_c80[0];
            }
          }
          else {
            iVar11 = (*aom_satd)(local_c80,(int)local_d30);
          }
          local_d28->rate = local_d28->rate + iVar11;
        }
        uVar8 = bVar18 & (uint)local_cf0;
        uVar12 = uVar12 + 1;
        iVar11 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        lVar17 = (*av1_highbd_block_error)(local_480,local_880,local_d30,&local_c88,(x->e_mbd).bd);
      }
      local_d28->dist = local_d28->dist + (lVar17 >> 2);
      iVar11 = (int)local_cd8 + iVar11;
      iVar16 = (int)local_cf8 + local_d04;
      uVar5 = (ulong)((int)local_ce0 + local_d44);
      uVar13 = local_ce8;
    }
    local_c98 = local_c98 + local_cb8;
    iVar16 = local_cd0 + local_d0c;
    uVar5 = (ulong)(uint)((int)local_c90 + (int)local_d20);
    local_d18 = local_d18 + local_ca8;
  } while( true );
}

Assistant:

void av1_block_yrd(MACROBLOCK *x, RD_STATS *this_rdc, int *skippable,
                   BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblockd_plane *pd = &xd->plane[AOM_PLANE_Y];
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int row_step = step * num_4x4_w >> tx_size;
  int block = 0;
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int use_hbd = is_cur_buf_hbd(xd);
  int num_blk_skip_w = num_4x4_w;

#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    aom_highbd_subtract_block(bh, bw, p->src_diff, bw, p->src.buf,
                              p->src.stride, pd->dst.buf, pd->dst.stride);
  } else {
    aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                       pd->dst.buf, pd->dst.stride);
  }
#else
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pd->dst.buf, pd->dst.stride);
#endif

  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  // For block sizes 8x16 or above, Hadamard txfm of two adjacent 8x8 blocks
  // can be done per function call. Hence the call of Hadamard txfm is
  // abstracted here for the specified cases.
  int is_tx_8x8_dual_applicable =
      (tx_size == TX_8X8 && block_size_wide[bsize] >= 16 &&
       block_size_high[bsize] >= 8);

#if CONFIG_AV1_HIGHBITDEPTH
  // As of now, dual implementation of hadamard txfm is available for low
  // bitdepth.
  if (use_hbd) is_tx_8x8_dual_applicable = 0;
#endif

  if (is_tx_8x8_dual_applicable) {
    aom_process_hadamard_lp_8x16(x, max_blocks_high, max_blocks_wide, num_4x4_w,
                                 step, block_step);
  }

  const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
#if CONFIG_AV1_HIGHBITDEPTH
  DECLARE_BLOCK_YRD_HBD_VARS()
#else
  (void)use_hbd;
#endif

  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()

      switch (tx_size) {
#if CONFIG_AV1_HIGHBITDEPTH
        case TX_16X16:
          if (use_hbd) {
            aom_hadamard_16x16(src_diff, diff_stride, coeff);
            av1_quantize_fp(coeff, 16 * 16, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob,
                            // default_scan_fp_16x16_transpose and
                            // av1_default_iscan_fp_16x16_transpose have to be
                            // used together.
                            default_scan_fp_16x16_transpose,
                            av1_default_iscan_fp_16x16_transpose);
          } else {
            aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
            av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX,
                            p->quant_fp_QTX, low_qcoeff, low_dqcoeff,
                            p->dequant_QTX, eob,
                            // default_scan_lp_16x16_transpose and
                            // av1_default_iscan_lp_16x16_transpose have to be
                            // used together.
                            default_scan_lp_16x16_transpose,
                            av1_default_iscan_lp_16x16_transpose);
          }
          break;
        case TX_8X8:
          if (use_hbd) {
            aom_hadamard_8x8(src_diff, diff_stride, coeff);
            av1_quantize_fp(
                coeff, 8 * 8, p->zbin_QTX, p->round_fp_QTX, p->quant_fp_QTX,
                p->quant_shift_QTX, qcoeff, dqcoeff, p->dequant_QTX, eob,
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          } else {
            if (is_tx_8x8_dual_applicable) {
              // The coeffs are pre-computed for the whole block, so re-assign
              // low_coeff to the appropriate location.
              const int block_offset = BLOCK_OFFSET(block + s);
              low_coeff = (int16_t *)p->coeff + block_offset;
            } else {
              aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
            }
            av1_quantize_lp(
                low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX, low_qcoeff,
                low_dqcoeff, p->dequant_QTX, eob,
                // default_scan_8x8_transpose and
                // av1_default_iscan_8x8_transpose have to be used together.
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          }
          break;
        default:
          assert(tx_size == TX_4X4);
          // In tx_size=4x4 case, aom_fdct4x4 and aom_fdct4x4_lp generate
          // normal coefficients order, so we don't need to change the scan
          // order here.
          if (use_hbd) {
            aom_fdct4x4(src_diff, coeff, diff_stride);
            av1_quantize_fp(coeff, 4 * 4, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob, scan_order->scan,
                            scan_order->iscan);
          } else {
            aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
            av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                            low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                            scan_order->scan, scan_order->iscan);
          }
          break;
#else
        case TX_16X16:
          aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
          av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_lp_16x16_transpose,
                          av1_default_iscan_lp_16x16_transpose);
          break;
        case TX_8X8:
          if (is_tx_8x8_dual_applicable) {
            // The coeffs are pre-computed for the whole block, so re-assign
            // low_coeff to the appropriate location.
            const int block_offset = BLOCK_OFFSET(block + s);
            low_coeff = (int16_t *)p->coeff + block_offset;
          } else {
            aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
          }
          av1_quantize_lp(low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_8x8_transpose,
                          av1_default_iscan_8x8_transpose);
          break;
        default:
          aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
          av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          scan_order->scan, scan_order->iscan);
          break;
#endif
      }
      assert(*eob <= 1024);
#if CONFIG_AV1_HIGHBITDEPTH
      if (use_hbd)
        update_yrd_loop_vars_hbd(x, &temp_skippable, step, *eob, coeff, qcoeff,
                                 dqcoeff, this_rdc, &eob_cost,
                                 r * num_blk_skip_w + c);
      else
#endif
        update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                             low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                             r * num_blk_skip_w + c);
    }
    block += row_step;
  }

  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }

  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}